

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

bounded_buffer * peparse::readFileToFileBuffer(char *filePath)

{
  int iVar1;
  bounded_buffer *pbVar2;
  buffer_detail *__s;
  char *in_RDI;
  void *maddr;
  stat s;
  buffer_detail *d;
  bounded_buffer *p;
  int fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_fffffffffffffd68;
  buffer_detail *local_258;
  bounded_buffer *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210 [32];
  uint8_t *local_1f0;
  string local_1e8 [32];
  string local_1c8 [32];
  stat local_1a8;
  string local_118 [24];
  _func_ios_base_ptr_ios_base_ptr *in_stack_ffffffffffffff00;
  string local_f8 [4];
  uint in_stack_ffffffffffffff0c;
  string local_c0 [32];
  string local_a0 [39];
  undefined1 local_79;
  bounded_buffer *local_78;
  bounded_buffer *local_70;
  string local_58 [32];
  string local_38 [36];
  int local_14;
  bounded_buffer *local_8;
  
  local_14 = open(in_RDI,0);
  if (local_14 == -1) {
    err = 7;
    std::__cxx11::string::assign(err_loc_abi_cxx11_);
    to_string<unsigned_int>(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
    std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    local_8 = (bounded_buffer *)0x0;
  }
  else {
    pbVar2 = (bounded_buffer *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    local_79 = 0;
    local_240 = (bounded_buffer *)0x0;
    if (pbVar2 != (bounded_buffer *)0x0) {
      local_79 = 1;
      local_78 = pbVar2;
      memset(pbVar2,0,0x18);
      local_240 = pbVar2;
    }
    local_70 = local_240;
    if (local_240 == (bounded_buffer *)0x0) {
      err = 1;
      std::__cxx11::string::assign(err_loc_abi_cxx11_);
      to_string<unsigned_int>(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
      std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_c0);
      local_8 = (bounded_buffer *)0x0;
    }
    else {
      memset(local_240,0,0x18);
      __s = (buffer_detail *)operator_new(4,(nothrow_t *)&std::nothrow);
      local_258 = (buffer_detail *)0x0;
      if (__s != (buffer_detail *)0x0) {
        memset(__s,0,4);
        local_258 = __s;
      }
      if (local_258 == (buffer_detail *)0x0) {
        if (local_70 != (bounded_buffer *)0x0) {
          operator_delete(local_70,0x18);
        }
        err = 1;
        std::__cxx11::string::assign(err_loc_abi_cxx11_);
        to_string<unsigned_int>(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
        std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_f8);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string(local_118);
        local_8 = (bounded_buffer *)0x0;
      }
      else {
        memset(local_258,0,4);
        local_70->detail = local_258;
        local_70->detail->fd = local_14;
        memset(&local_1a8,0,0x90);
        iVar1 = fstat(local_14,&local_1a8);
        if (iVar1 == 0) {
          local_1f0 = (uint8_t *)mmap((void *)0x0,local_1a8.st_size,1,1,local_14,0);
          if (local_1f0 == (uint8_t *)0xffffffffffffffff) {
            close(local_14);
            if (local_258 != (buffer_detail *)0x0) {
              operator_delete(local_258,4);
            }
            pbVar2 = local_70;
            if (local_70 != (bounded_buffer *)0x0) {
              operator_delete(local_70,0x18);
            }
            err = 1;
            std::__cxx11::string::assign(err_loc_abi_cxx11_);
            __rhs = &local_230;
            to_string<unsigned_int>(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
            std::operator+((char *)pbVar2,__rhs);
            std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_210);
            std::__cxx11::string::~string(local_210);
            std::__cxx11::string::~string((string *)&local_230);
            local_8 = (bounded_buffer *)0x0;
          }
          else {
            local_70->buf = local_1f0;
            local_70->bufLen = (uint32_t)local_1a8.st_size;
            local_70->copy = false;
            local_70->swapBytes = false;
            local_8 = local_70;
          }
        }
        else {
          close(local_14);
          if (local_258 != (buffer_detail *)0x0) {
            operator_delete(local_258,4);
          }
          if (local_70 != (bounded_buffer *)0x0) {
            operator_delete(local_70,0x18);
          }
          err = 8;
          std::__cxx11::string::assign(err_loc_abi_cxx11_);
          to_string<unsigned_int>(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
          std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
          std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_1c8);
          std::__cxx11::string::~string(local_1c8);
          std::__cxx11::string::~string(local_1e8);
          local_8 = (bounded_buffer *)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

bounded_buffer *readFileToFileBuffer(const char *filePath) {
#ifdef _WIN32
  HANDLE h = CreateFileA(filePath,
                         GENERIC_READ,
                         FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE,
                         nullptr,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         nullptr);
  if (h == INVALID_HANDLE_VALUE) {
    PE_ERR(PEERR_OPEN);
    return nullptr;
  }

  DWORD fileSize = GetFileSize(h, nullptr);

  if (fileSize == INVALID_FILE_SIZE) {
    CloseHandle(h);
    PE_ERR(PEERR_OPEN);
    return nullptr;
  }

#else
  // only where we have mmap / open / etc
  int fd = open(filePath, O_RDONLY);

  if (fd == -1) {
    PE_ERR(PEERR_OPEN);
    return nullptr;
  }
#endif

  // make a buffer object
  bounded_buffer *p = new (std::nothrow) bounded_buffer();
  if (p == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  memset(p, 0, sizeof(bounded_buffer));
  buffer_detail *d = new (std::nothrow) buffer_detail();

  if (d == nullptr) {
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }
  memset(d, 0, sizeof(buffer_detail));
  p->detail = d;

// only where we have mmap / open / etc
#ifdef _WIN32
  p->detail->file = h;

  HANDLE hMap = CreateFileMapping(h, nullptr, PAGE_READONLY, 0, 0, nullptr);

  if (hMap == nullptr) {
    CloseHandle(h);
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->detail->sec = hMap;

  LPVOID ptr = MapViewOfFile(hMap, FILE_MAP_READ, 0, 0, 0);

  if (ptr == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->buf = reinterpret_cast<std::uint8_t *>(ptr);
  p->bufLen = fileSize;
#else
  p->detail->fd = fd;

  struct stat s;
  memset(&s, 0, sizeof(struct stat));

  if (fstat(fd, &s) != 0) {
    close(fd);
    delete d;
    delete p;
    PE_ERR(PEERR_STAT);
    return nullptr;
  }

  void *maddr = mmap(nullptr,
                     static_cast<std::size_t>(s.st_size),
                     PROT_READ,
                     MAP_SHARED,
                     fd,
                     0);

  if (maddr == MAP_FAILED) {
    close(fd);
    delete d;
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->buf = reinterpret_cast<std::uint8_t *>(maddr);
  p->bufLen = static_cast<std::uint32_t>(s.st_size);
#endif
  p->copy = false;
  p->swapBytes = false;

  return p;
}